

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

void __thiscall llvm::DWARFVerifier::verifyDebugLineStmtOffsets(DWARFVerifier *this)

{
  DIDumpOptions *pDVar1;
  undefined8 *puVar2;
  uint uVar3;
  DWARFContext *this_00;
  DWARFUnit *this_01;
  _Base_ptr p_Var4;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar5;
  int iVar6;
  LineTable *pLVar7;
  undefined4 extraout_var;
  _Base_ptr p_Var8;
  raw_ostream *prVar9;
  char *pcVar10;
  mapped_type *pmVar11;
  DIDumpOptions *pDVar12;
  void *__buf;
  void *__buf_00;
  undefined1 in_R8B;
  map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  *pmVar13;
  size_t *this_02;
  undefined8 *puVar14;
  OptionalStorage<unsigned_long,_true> OVar15;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  undefined1 local_d8 [8];
  map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  StmtListToDie;
  anon_union_48_2_fc7899a5_for_OptionalStorage<llvm::DWARFFormValue,_true>_2 local_90;
  char local_60;
  undefined1 auStack_58 [8];
  DWARFDie Die;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_38;
  uint64_t LineTableOffset;
  
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&StmtListToDie;
  StmtListToDie._M_t._M_impl._0_4_ = 0;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  this_00 = this->DCtx;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  DWARFContext::parseNormalUnits(this_00);
  uVar3 = (this_00->NormalUnits).NumInfoUnits;
  if (uVar3 == 0xffffffff) {
    uVar3 = (this_00->NormalUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
            .
            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            .super_SmallVectorBase.Size;
  }
  if (uVar3 != 0) {
    puVar14 = (undefined8 *)
              (this_00->NormalUnits).
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              .
              super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              .
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
              .
              super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
              .super_SmallVectorBase.BeginX;
    puVar2 = puVar14 + uVar3;
    pDVar1 = &this->DumpOpts;
    Die.Die = (DWARFDebugInfoEntry *)&PTR_home_01097f70;
    do {
      this_01 = (DWARFUnit *)*puVar14;
      DWARFUnit::extractDIEsIfNeeded(this_01,true);
      Die.U = (DWARFUnit *)
              (this_01->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
      auStack_58 = (undefined1  [8])this_01;
      if (Die.U == (DWARFUnit *)
                   (this_01->DieArray).
                   super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        Die.U = (DWARFUnit *)0x0;
        auStack_58 = (undefined1  [8])(DWARFUnit *)0x0;
      }
      DWARFDie::find((Optional<llvm::DWARFFormValue> *)&local_90.value,(DWARFDie *)auStack_58,
                     DW_AT_stmt_list);
      if (local_60 == '\x01') {
        OVar15 = (OptionalStorage<unsigned_long,_true>)
                 DWARFFormValue::getAsSectionOffset(&local_90.value);
      }
      else {
        OVar15 = (OptionalStorage<unsigned_long,_true>)ZEXT816(0);
      }
      if (((undefined1  [16])OVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_38.value = OVar15.field_0.value;
        pLVar7 = DWARFContext::getLineTableForUnit(this->DCtx,(DWARFUnit *)*puVar14);
        aVar5 = local_38;
        iVar6 = (*((this->DCtx->DObj)._M_t.
                   super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                   .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                  _vptr_DWARFObject[0xf])();
        if ((ulong)aVar5 < *(_Base_ptr *)(CONCAT44(extraout_var,iVar6) + 8)) {
          if (pLVar7 == (LineTable *)0x0) {
            this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
            prVar9 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
            Str_02.Length = 0xc;
            Str_02.Data = ".debug_line[";
            prVar9 = raw_ostream::operator<<(prVar9,Str_02);
            local_90.value.Value.field_0 =
                 (anon_union_8_3_82d75f4a_for_ValueType_0)((long)"String: 0x%08lx" + 8);
            local_90._0_8_ = Die.Die;
            local_90.value.Value.data = (uint8_t *)local_38;
            prVar9 = raw_ostream::operator<<(prVar9,(format_object_base *)&local_90.value);
            Str_03.Length = 0x24;
            Str_03.Data = "] was not able to be parsed for CU:\n";
            raw_ostream::operator<<(prVar9,Str_03);
            pDVar12 = pDVar1;
            DWARFDie::dump((DWARFDie *)auStack_58,this->OS,0,*pDVar1);
            prVar9 = this->OS;
            pcVar10 = prVar9->OutBufCur;
            if (pcVar10 < prVar9->OutBufEnd) {
LAB_00d97fa6:
              prVar9->OutBufCur = pcVar10 + 1;
              *pcVar10 = '\n';
            }
            else {
              raw_ostream::write(prVar9,10,__buf_00,(size_t)pDVar12);
            }
          }
          else {
            p_Var8 = (_Base_ptr)&StmtListToDie;
            for (p_Var4 = (_Base_ptr)
                          StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                p_Var4 != (_Base_ptr)0x0;
                p_Var4 = (&p_Var4->_M_left)[*(_Base_ptr *)(p_Var4 + 1) < local_38.value]) {
              if (*(_Base_ptr *)(p_Var4 + 1) >= local_38.value) {
                p_Var8 = p_Var4;
              }
            }
            pmVar13 = &StmtListToDie;
            if ((p_Var8 != (_Base_ptr)&StmtListToDie) &&
               (pmVar13 = (map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                           *)p_Var8,
               local_38.value <
               (((map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                  *)p_Var8)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right)) {
              pmVar13 = &StmtListToDie;
            }
            if (pmVar13 == &StmtListToDie) {
              pmVar11 = std::
                        map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                        ::operator[]((map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                                      *)local_d8,&local_38.value);
              pmVar11->U = (DWARFUnit *)auStack_58;
              pmVar11->Die = (DWARFDebugInfoEntry *)Die.U;
            }
            else {
              this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
              prVar9 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              Str.Length = 0x17;
              Str.Data = "two compile unit DIEs, ";
              prVar9 = raw_ostream::operator<<(prVar9,Str);
              this_02 = &(pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
              local_90.value.Value.data = (uint8_t *)DWARFDie::getOffset((DWARFDie *)this_02);
              local_90.value.Value.field_0 =
                   (anon_union_8_3_82d75f4a_for_ValueType_0)((long)"String: 0x%08lx" + 8);
              local_90._0_8_ = Die.Die;
              prVar9 = raw_ostream::operator<<(prVar9,(format_object_base *)&local_90.value);
              Str_00.Length = 5;
              Str_00.Data = " and ";
              prVar9 = raw_ostream::operator<<(prVar9,Str_00);
              if ((auStack_58 == (undefined1  [8])0x0) || (Die.U == (DWARFUnit *)0x0)) {
                __assert_fail("isValid() && \"must check validity prior to calling\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                              ,0x43,"uint64_t llvm::DWARFDie::getOffset() const");
              }
              StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)Die.Die;
              prVar9 = raw_ostream::operator<<
                                 (prVar9,(format_object_base *)
                                         &StmtListToDie._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
              Str_01.Length = 0x30;
              Str_01.Data = ", have the same DW_AT_stmt_list section offset:\n";
              raw_ostream::operator<<(prVar9,Str_01);
              DWARFDie::dump((DWARFDie *)this_02,this->OS,0,*pDVar1);
              pDVar12 = pDVar1;
              DWARFDie::dump((DWARFDie *)auStack_58,this->OS,0,*pDVar1);
              prVar9 = this->OS;
              pcVar10 = prVar9->OutBufCur;
              if (pcVar10 < prVar9->OutBufEnd) goto LAB_00d97fa6;
              raw_ostream::write(prVar9,10,__buf,(size_t)pDVar12);
            }
          }
        }
        else if (pLVar7 != (LineTable *)0x0) {
          __assert_fail("LineTable == nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                        ,0x2a7,"void llvm::DWARFVerifier::verifyDebugLineStmtOffsets()");
        }
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar2);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDie>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDie>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDie>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDie>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
               *)local_d8);
  return;
}

Assistant:

void DWARFVerifier::verifyDebugLineStmtOffsets() {
  std::map<uint64_t, DWARFDie> StmtListToDie;
  for (const auto &CU : DCtx.compile_units()) {
    auto Die = CU->getUnitDIE();
    // Get the attribute value as a section offset. No need to produce an
    // error here if the encoding isn't correct because we validate this in
    // the .debug_info verifier.
    auto StmtSectionOffset = toSectionOffset(Die.find(DW_AT_stmt_list));
    if (!StmtSectionOffset)
      continue;
    const uint64_t LineTableOffset = *StmtSectionOffset;
    auto LineTable = DCtx.getLineTableForUnit(CU.get());
    if (LineTableOffset < DCtx.getDWARFObj().getLineSection().Data.size()) {
      if (!LineTable) {
        ++NumDebugLineErrors;
        error() << ".debug_line[" << format("0x%08" PRIx64, LineTableOffset)
                << "] was not able to be parsed for CU:\n";
        dump(Die) << '\n';
        continue;
      }
    } else {
      // Make sure we don't get a valid line table back if the offset is wrong.
      assert(LineTable == nullptr);
      // Skip this line table as it isn't valid. No need to create an error
      // here because we validate this in the .debug_info verifier.
      continue;
    }
    auto Iter = StmtListToDie.find(LineTableOffset);
    if (Iter != StmtListToDie.end()) {
      ++NumDebugLineErrors;
      error() << "two compile unit DIEs, "
              << format("0x%08" PRIx64, Iter->second.getOffset()) << " and "
              << format("0x%08" PRIx64, Die.getOffset())
              << ", have the same DW_AT_stmt_list section offset:\n";
      dump(Iter->second);
      dump(Die) << '\n';
      // Already verified this line table before, no need to do it again.
      continue;
    }
    StmtListToDie[LineTableOffset] = Die;
  }
}